

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O3

bool __thiscall QMakeParser::failOperator(QMakeParser *this,char *msg)

{
  char *pcVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QAnyStringView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QAnyStringView QVar11;
  QArrayData *local_78;
  int local_70;
  QChar local_68;
  QArrayData *local_60 [3];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = this->m_invert != 0;
  if (bVar4) {
    QVar5.m_data = (storage_type *)0x1b;
    QVar5.m_size = (qsizetype)local_60;
    QString::fromLatin1(QVar5);
    if (msg == (char *)0x0) {
      psVar3 = (storage_type *)0x0;
    }
    else {
      psVar2 = (storage_type *)0xffffffffffffffff;
      do {
        psVar3 = psVar2 + 1;
        pcVar1 = msg + 1 + (long)psVar2;
        psVar2 = psVar3;
      } while (*pcVar1 != '\0');
    }
    QVar6.m_data = psVar3;
    QVar6.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar6);
    QVar7.m_size = (size_t)local_60;
    QVar7.field_0.m_data = local_48;
    QString::arg_impl(QVar7,local_70,local_68);
    message(this,0x301,(QString *)local_48);
    this->m_proFile->m_ok = false;
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    this->m_invert = 0;
  }
  if (this->m_operator == OrOperator) {
    QVar9.m_data = &DAT_0000001a;
    QVar9.m_size = (qsizetype)local_60;
    QString::fromLatin1(QVar9);
    if (msg == (char *)0x0) {
LAB_0029372c:
      psVar2 = (storage_type *)0x0;
    }
    else {
      psVar3 = (storage_type *)0xffffffffffffffff;
      do {
        psVar2 = psVar3 + 1;
        pcVar1 = msg + 1 + (long)psVar3;
        psVar3 = psVar2;
      } while (*pcVar1 != '\0');
    }
  }
  else {
    if (this->m_operator != AndOperator) goto LAB_002937ea;
    QVar8.m_data = (storage_type *)0x1b;
    QVar8.m_size = (qsizetype)local_60;
    QString::fromLatin1(QVar8);
    if (msg == (char *)0x0) goto LAB_0029372c;
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar2 = psVar3 + 1;
      pcVar1 = msg + 1 + (long)psVar3;
      psVar3 = psVar2;
    } while (*pcVar1 != '\0');
  }
  QVar10.m_data = psVar2;
  QVar10.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar10);
  QVar11.m_size = (size_t)local_60;
  QVar11.field_0.m_data = local_48;
  QString::arg_impl(QVar11,local_70,local_68);
  message(this,0x301,(QString *)local_48);
  this->m_proFile->m_ok = false;
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  if (local_60[0] != (QArrayData *)0x0) {
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60[0],2,0x10);
    }
  }
  this->m_operator = NoOperator;
  bVar4 = true;
LAB_002937ea:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QMakeParser::failOperator(const char *msg)
{
    bool fail = false;
    if (m_invert) {
        parseError(fL1S("Unexpected NOT operator %1.").arg(fL1S(msg)));
        m_invert = 0;
        fail = true;
    }
    if (m_operator == AndOperator) {
        parseError(fL1S("Unexpected AND operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
        fail = true;
    } else if (m_operator == OrOperator) {
        parseError(fL1S("Unexpected OR operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
        fail = true;
    }
    return fail;
}